

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

byte * __thiscall
Js::AsmJSByteCodeGenerator::SetConstsToTable<_SIMDValue>
          (AsmJSByteCodeGenerator *this,byte *byteTable,_SIMDValue zeroValue)

{
  int *__return_storage_ptr__;
  bool bVar1;
  AsmJsRegisterSpace<_SIMDValue> *this_00;
  EntryType *this_01;
  _SIMDValue *p_Var2;
  undefined1 local_88 [8];
  EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  intMap;
  _SIMDValue *typedTable;
  byte *byteTable_local;
  AsmJSByteCodeGenerator *this_local;
  _SIMDValue zeroValue_local;
  
  *(long *)byteTable = zeroValue.field_0._0_8_;
  *(long *)(byteTable + 8) = zeroValue.field_0._8_8_;
  intMap.stats = (Type)(byteTable + 0x10);
  this_00 = AsmJsFunc::GetRegisterSpace<_SIMDValue>(this->mFunction);
  __return_storage_ptr__ =
       &it.
        super_IteratorBase<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
        .usedEntryCount;
  AsmJsRegisterSpace<_SIMDValue>::GetConstMap((ConstMap *)__return_storage_ptr__,this_00);
  JsUtil::
  BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::GetIterator((EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 *)local_88,
                (BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)__return_storage_ptr__);
  while( true ) {
    bVar1 = JsUtil::
            BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_88);
    if (!bVar1) break;
    this_01 = JsUtil::
              BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_88);
    p_Var2 = JsUtil::anon_unknown_9::KeyValueEntry<_SIMDValue,_unsigned_int>::Key
                       ((KeyValueEntry<_SIMDValue,_unsigned_int> *)this_01);
    (intMap.stats)->pNext = (DictionaryStats *)(p_Var2->field_0).f64[0];
    *(Type *)&(intMap.stats)->initialSize = (p_Var2->field_0).f64[1];
    intMap.stats = (Type)&(intMap.stats)->countOfEmptyBuckets;
    JsUtil::
    BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_88);
  }
  JsUtil::
  BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&it.
                        super_IteratorBase<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<_SIMDValue,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                        .usedEntryCount);
  return (byte *)intMap.stats;
}

Assistant:

byte* AsmJSByteCodeGenerator::SetConstsToTable(byte* byteTable, T zeroValue)
    {
        T* typedTable = (T*)byteTable;
        // Return Register
        *typedTable = zeroValue;
        typedTable++;

        JsUtil::BaseDictionary<T, RegSlot, ArenaAllocator, PowerOf2SizePolicy, AsmJsComparer> intMap = mFunction->GetRegisterSpace<T>().GetConstMap();

        for (auto it = intMap.GetIterator(); it.IsValid(); it.MoveNext())
        {
            *typedTable = it.Current().Key();
            typedTable++;
        }
        return (byte*)typedTable;
    }